

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O3

ggwave_Instance ggwave_init(ggwave_Parameters parameters)

{
  GGWave *this;
  long lVar1;
  long *plVar2;
  int in_stack_00000028;
  Parameters local_44;
  
  plVar2 = &(anonymous_namespace)::g_instances;
  lVar1 = 0;
  do {
    if (*plVar2 == 0) {
      this = (GGWave *)operator_new(0x5b8);
      local_44.operatingMode = in_stack_00000028;
      GGWave::GGWave(this,&local_44);
      *plVar2 = (long)this;
      goto LAB_00104c82;
    }
    lVar1 = lVar1 + 1;
    plVar2 = plVar2 + 1;
  } while (lVar1 != 4);
  lVar1 = 0xffffffff;
  if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
    fprintf((anonymous_namespace)::g_fptr,
            "Failed to create GGWave instance - reached maximum number of instances (%d)\n",4);
  }
LAB_00104c82:
  return (ggwave_Instance)lVar1;
}

Assistant:

ggwave_Instance ggwave_init(ggwave_Parameters parameters) {
    for (ggwave_Instance id = 0; id < GGWAVE_MAX_INSTANCES; ++id) {
        if (g_instances[id] == nullptr) {
            g_instances[id] = new GGWave({
                parameters.payloadLength,
                parameters.sampleRateInp,
                parameters.sampleRateOut,
                parameters.sampleRate,
                parameters.samplesPerFrame,
                parameters.soundMarkerThreshold,
                parameters.sampleFormatInp,
                parameters.sampleFormatOut,
                parameters.operatingMode});

            return id;
        }
    }

    ggprintf("Failed to create GGWave instance - reached maximum number of instances (%d)\n", GGWAVE_MAX_INSTANCES);

    return -1;
}